

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_function.cpp
# Opt level: O2

void duckdb::ApplyWindowStats
               (WindowBoundary *boundary,FrameDelta *delta,BaseStatistics *base,bool is_start)

{
  StatisticsType SVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  InternalException *pIVar6;
  char *pcVar7;
  allocator local_41;
  string local_40;
  
  switch(*boundary) {
  case INVALID:
    pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
    pcVar7 = "Unknown window end boundary";
    if (is_start) {
      pcVar7 = "Unknown window start boundary";
    }
    ::std::__cxx11::string::string((string *)&local_40,pcVar7,&local_41);
    InternalException::InternalException(pIVar6,&local_40);
    __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case UNBOUNDED_PRECEDING:
    if (!is_start) goto LAB_015bc829;
    delta->end = 0;
    break;
  case UNBOUNDED_FOLLOWING:
    if (is_start) {
LAB_015bc7db:
      pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,"Unsupported window start boundary",&local_41);
      InternalException::InternalException(pIVar6,&local_40);
      __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    delta->begin = 0;
    break;
  case CURRENT_ROW_RANGE:
  case EXPR_PRECEDING_RANGE:
  case EXPR_FOLLOWING_RANGE:
  case CURRENT_ROW_GROUPS:
  case EXPR_PRECEDING_GROUPS:
  case EXPR_FOLLOWING_GROUPS:
    break;
  case CURRENT_ROW_ROWS:
    delta->begin = 0;
    delta->end = 0;
    break;
  case EXPR_PRECEDING_ROWS:
    if (base == (BaseStatistics *)0x0) {
      return;
    }
    SVar1 = BaseStatistics::GetStatsType(base);
    if (SVar1 != NUMERIC_STATS) {
      return;
    }
    bVar2 = NumericStats::HasMinMax(base);
    if (!bVar2) {
      return;
    }
    lVar3 = NumericStats::GetMin<long>(base);
    lVar4 = NumericStats::GetMax<long>(base);
    lVar5 = delta->begin;
    if (lVar4 < delta->end && lVar5 < lVar4) {
      lVar5 = -lVar4;
      delta->begin = lVar5;
    }
    if (delta->end <= lVar3 || lVar3 <= lVar5) {
      return;
    }
    lVar3 = -lVar3;
    goto LAB_015bc7cd;
  case EXPR_FOLLOWING_ROWS:
    if (base == (BaseStatistics *)0x0) {
      return;
    }
    SVar1 = BaseStatistics::GetStatsType(base);
    if (SVar1 != NUMERIC_STATS) {
      return;
    }
    bVar2 = NumericStats::HasMinMax(base);
    if (!bVar2) {
      return;
    }
    NumericStats::GetMin<long>(base);
    lVar3 = NumericStats::GetMax<long>(base);
    if (delta->end <= lVar3) {
      return;
    }
LAB_015bc7cd:
    delta->end = lVar3 + 1;
    break;
  default:
    if (is_start) goto LAB_015bc7db;
LAB_015bc829:
    pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_40,"Unsupported window end boundary",&local_41);
    InternalException::InternalException(pIVar6,&local_40);
    __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

static void ApplyWindowStats(const WindowBoundary &boundary, FrameDelta &delta, BaseStatistics *base, bool is_start) {
	// Avoid overflow by clamping to the frame bounds
	auto base_stats = delta;

	switch (boundary) {
	case WindowBoundary::UNBOUNDED_PRECEDING:
		if (is_start) {
			delta.end = 0;
			return;
		}
		break;
	case WindowBoundary::UNBOUNDED_FOLLOWING:
		if (!is_start) {
			delta.begin = 0;
			return;
		}
		break;
	case WindowBoundary::CURRENT_ROW_ROWS:
		delta.begin = delta.end = 0;
		return;
	case WindowBoundary::EXPR_PRECEDING_ROWS:
		if (base && base->GetStatsType() == StatisticsType::NUMERIC_STATS && NumericStats::HasMinMax(*base)) {
			//	Preceding so negative offset from current row
			base_stats.begin = NumericStats::GetMin<int64_t>(*base);
			base_stats.end = NumericStats::GetMax<int64_t>(*base);
			if (delta.begin < base_stats.end && base_stats.end < delta.end) {
				delta.begin = -base_stats.end;
			}
			if (delta.begin < base_stats.begin && base_stats.begin < delta.end) {
				delta.end = -base_stats.begin + 1;
			}
		}
		return;
	case WindowBoundary::EXPR_FOLLOWING_ROWS:
		if (base && base->GetStatsType() == StatisticsType::NUMERIC_STATS && NumericStats::HasMinMax(*base)) {
			base_stats.begin = NumericStats::GetMin<int64_t>(*base);
			base_stats.end = NumericStats::GetMax<int64_t>(*base);
			if (base_stats.end < delta.end) {
				delta.end = base_stats.end + 1;
			}
		}
		return;

	case WindowBoundary::CURRENT_ROW_RANGE:
	case WindowBoundary::EXPR_PRECEDING_RANGE:
	case WindowBoundary::EXPR_FOLLOWING_RANGE:
		return;
	case WindowBoundary::CURRENT_ROW_GROUPS:
	case WindowBoundary::EXPR_PRECEDING_GROUPS:
	case WindowBoundary::EXPR_FOLLOWING_GROUPS:
		return;
	case WindowBoundary::INVALID:
		throw InternalException(is_start ? "Unknown window start boundary" : "Unknown window end boundary");
		break;
	}

	if (is_start) {
		throw InternalException("Unsupported window start boundary");
	} else {
		throw InternalException("Unsupported window end boundary");
	}
}